

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator-(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble *plVar1;
  long lVar2;
  long lVar3;
  long *in_RDX;
  long *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble *end;
  longdouble *pr;
  longdouble *pa;
  longdouble *pm;
  TPZSFMatrix<long_double> *res;
  char *in_stack_00000178;
  char *in_stack_00000180;
  int64_t in_stack_ffffffffffffffb8;
  TPZSFMatrix<long_double> *in_stack_ffffffffffffffc0;
  longdouble *local_38;
  longdouble *local_30;
  longdouble *local_28;
  
  lVar2 = (**(code **)(*in_RDX + 0x60))();
  lVar3 = (**(code **)(*in_RSI + 0x60))();
  if (lVar2 != lVar3) {
    TPZMatrix<long_double>::Error(in_stack_00000180,in_stack_00000178);
  }
  (**(code **)(*in_RSI + 0x60))();
  TPZSFMatrix(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_28 = (longdouble *)in_RSI[4];
  local_30 = (longdouble *)in_RDX[4];
  local_38 = in_RDI->fElem;
  plVar1 = in_RDI->fElem;
  lVar2 = (**(code **)(*in_RSI + 600))();
  while (local_38 < plVar1 + lVar2) {
    *local_38 = *local_28 - *local_30;
    local_38 = local_38 + 1;
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar> 
TPZSFMatrix<TVar> ::operator-(const TPZSFMatrix<TVar>  &A ) const
{
	if ( A.Dim() != this->Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator- <matrixs with different dimensions>" );
	
	TPZSFMatrix<TVar>  res( this->Dim() );
	TVar *pm  = fElem;
	TVar *pa  = A.fElem;
	TVar *pr  = res.fElem;
	TVar *end = &(res.fElem[Size()]);
	
	while ( pr < end )
		*pr++ = (*pm++) - (*pa++);
	
	return( res );
}